

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::PortConnection::makeConnections
          (PortConnection *this,InstanceSymbol *instance,
          span<const_slang::ast::Symbol_*const,_18446744073709551615UL> ports,
          SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *portConnections,
          SmallVector<const_slang::ast::PortConnection_*,_5UL> *results)

{
  group_type_pointer pgVar1;
  SymbolKind SVar2;
  ArgumentDirection AVar3;
  Scope *scope;
  int *piVar4;
  PortSymbol *args;
  ExpressionSyntax *pEVar5;
  Expression *pEVar6;
  PortConnectionSyntax *pPVar7;
  size_t sVar8;
  int iVar9;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  undefined8 this_00;
  group_type_pointer pgVar10;
  value_type_pointer ppVar11;
  ulong uVar12;
  bool bVar13;
  byte bVar14;
  uint uVar15;
  uint64_t uVar16;
  PortConnection *conn_00;
  SourceLocation SVar17;
  Diagnostic *pDVar18;
  PropertyExprSyntax *pPVar19;
  ulong uVar20;
  InstanceArraySymbol *sym;
  long *plVar21;
  basic_string_view<char,_std::char_traits<char>_> *pbVar22;
  ulong uVar23;
  long lVar24;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>
  *pair;
  Info *pIVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  byte bVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  byte bVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  byte bVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  byte bVar45;
  LookupLocation LVar46;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar47;
  SourceRange SVar48;
  string_view arg;
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  LookupLocation lookupLocation_01;
  LookupLocation lookupLocation_02;
  LookupLocation lookupLocation_03;
  LookupLocation lookupLocation_04;
  PortConnection *conn;
  PortConnectionBuilder builder;
  bool local_311;
  basic_string_view<char,_std::char_traits<char>_> *local_310;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *local_308;
  ulong local_300;
  ulong local_2f8;
  PortConnection *local_2f0;
  Token local_2e8;
  uchar local_2d8;
  uchar uStack_2d7;
  uchar uStack_2d6;
  byte bStack_2d5;
  uchar uStack_2d4;
  uchar uStack_2d3;
  uchar uStack_2d2;
  byte bStack_2d1;
  uchar uStack_2d0;
  uchar uStack_2cf;
  uchar uStack_2ce;
  byte bStack_2cd;
  uchar uStack_2cc;
  uchar uStack_2cb;
  uchar uStack_2ca;
  byte bStack_2c9;
  group_type_pointer local_2c0;
  InstanceSymbol *local_2b8;
  InstanceSymbol *local_2b0;
  undefined1 local_2a8 [376];
  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
  local_130;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> local_f8;
  SourceRange local_e8;
  bool local_d8;
  bool local_d7;
  SmallVector<slang::ConstantRange,_4UL> local_c8;
  ulong local_90;
  undefined2 local_88;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  scope = (Scope *)(this->field_4).exprSyntax;
  local_2a8._16_8_ = scope->compilation;
  local_2a8._0_8_ = scope;
  local_2a8._8_8_ = this;
  LVar46 = LookupLocation::after((Symbol *)this);
  local_2a8._24_8_ = LVar46.scope;
  local_2a8._32_4_ = LVar46.index;
  lookupLocation._12_4_ = 0;
  lookupLocation.scope = (Scope *)SUB128(LVar46._0_12_,0);
  lookupLocation.index = SUB124(LVar46._0_12_,8);
  ConnMap::ConnMap((ConnMap *)(local_2a8 + 0x30),
                   (SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)
                   ports._M_extent._M_extent_value._M_extent_value,scope,lookupLocation);
  local_c8.super_SmallVectorBase<slang::ConstantRange>.data_ =
       (pointer)local_c8.super_SmallVectorBase<slang::ConstantRange>.firstElement;
  local_c8.super_SmallVectorBase<slang::ConstantRange>.len = 0;
  local_c8.super_SmallVectorBase<slang::ConstantRange>.cap = 4;
  local_90 = 0;
  local_88._0_1_ = false;
  local_88._1_1_ = false;
  plVar21 = (long *)local_2a8;
  while ((*plVar21 != 0 && (piVar4 = *(int **)(*plVar21 + 8), *piVar4 == 0x31))) {
    SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange_const&>
              (&local_c8.super_SmallVectorBase<slang::ConstantRange>,
               (ConstantRange *)(piVar4 + 0x22));
    plVar21 = (long *)(piVar4 + 8);
  }
  std::ranges::__reverse_fn::operator()<slang::SmallVector<slang::ConstantRange,_4UL>_&>
            ((__reverse_fn *)&std::ranges::reverse,&local_c8);
  local_2b8 = (InstanceSymbol *)
              (&(instance->super_InstanceSymbolBase).super_Symbol.kind + (long)ports._M_ptr * 2);
  local_308 = portConnections;
  do {
    if (instance == local_2b8) {
      if (local_d8 == true) {
        if (local_90 < (ulong)local_2a8._56_8_) {
          local_2e8 = slang::syntax::SyntaxNode::getFirstToken
                                (&(*(pointer)(local_2a8._48_8_ + local_90 * 8))->super_SyntaxNode);
          SVar17 = parsing::Token::location(&local_2e8);
          pDVar18 = Scope::addDiag((Scope *)local_2a8._0_8_,(DiagCode)0xc80006,SVar17);
          Diagnostic::operator<<
                    (pDVar18,*(string_view *)
                              ((*(ModportSymbol **)(local_2a8._8_8_ + 0x50))[1].super_Symbol.name.
                               _M_str + 8));
          Diagnostic::operator<<<unsigned_long>(pDVar18,local_2a8._56_8_);
          Diagnostic::operator<<<unsigned_long>(pDVar18,local_90);
        }
      }
      else {
        local_2e8 = (Token)boost::unordered::detail::foa::
                           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                           ::begin(&local_130);
        pIVar25 = local_2e8.info;
        while (this_00 = local_2a8._0_8_, pIVar25 != (Info *)0x0) {
          if (*(char *)&pIVar25[1].location == '\0') {
            SVar17 = parsing::Token::location((Token *)(pIVar25[1].rawTextPtr + 0x60));
            pDVar18 = Scope::addDiag((Scope *)this_00,(DiagCode)0xa00006,SVar17);
            arg = parsing::Token::valueText((Token *)(pIVar25[1].rawTextPtr + 0x60));
            Diagnostic::operator<<(pDVar18,arg);
            Diagnostic::operator<<
                      (pDVar18,*(string_view *)
                                ((*(ModportSymbol **)(local_2a8._8_8_ + 0x50))[1].super_Symbol.name.
                                 _M_str + 8));
          }
          boost::unordered::detail::foa::
          table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
          ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                       *)&local_2e8);
          pIVar25 = local_2e8.info;
        }
      }
      anon_unknown_0::PortConnectionBuilder::~PortConnectionBuilder
                ((PortConnectionBuilder *)local_2a8);
      return;
    }
    args = *(PortSymbol **)&(instance->super_InstanceSymbolBase).super_Symbol;
    SVar2 = (args->super_Symbol).kind;
    local_2b0 = instance;
    if (SVar2 == MultiPort) {
      local_2e8.info = (Info *)local_2a8;
      local_2e8._0_8_ = args;
      if (local_d8 == true) {
        uVar20 = local_90 + 1;
        if ((ulong)local_2a8._56_8_ <= local_90) goto LAB_002129e0;
        pPVar7 = *(pointer)(local_2a8._48_8_ + local_90 * 8);
        syntax_00._M_ptr =
             (pPVar7->attributes).
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
        syntax_00._M_extent._M_extent_value =
             (pPVar7->attributes).
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
             _M_extent_value;
        lookupLocation_01.index = local_2a8._32_4_;
        lookupLocation_01.scope = (Scope *)local_2a8._24_8_;
        lookupLocation_01._12_4_ = 0;
        local_90 = local_90 + 1;
        sVar47 = AttributeSymbol::fromSyntax(syntax_00,(Scope *)local_2a8._0_8_,lookupLocation_01);
        if ((pPVar7->super_SyntaxNode).kind == OrderedPortConnection) {
          pPVar19 = *(PropertyExprSyntax **)&pPVar7[1].super_SyntaxNode;
LAB_00212c45:
          conn_00 = anon_unknown_0::PortConnectionBuilder::
                    createConnection<slang::ast::MultiPortSymbol>
                              ((PortConnectionBuilder *)local_2a8,(MultiPortSymbol *)args,pPVar19,
                               sVar47);
        }
        else {
          local_311 = false;
          conn_00 = BumpAllocator::
                    emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&,bool>
                              ((BumpAllocator *)local_2a8._16_8_,(MultiPortSymbol *)args,&local_311)
          ;
          if (sVar47._M_extent._M_extent_value._M_extent_value != 0) {
            Compilation::setAttributes((Compilation *)local_2a8._16_8_,conn_00,sVar47);
          }
        }
      }
      else {
        uVar20 = local_90;
        if ((args->super_Symbol).name._M_len != 0) {
          pbVar22 = &(args->super_Symbol).name;
          uVar16 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_130,pbVar22);
          uVar20 = uVar16 >> ((byte)local_130.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                                    .arrays.groups_size_index & 0x3f);
          lVar24 = (uVar16 & 0xff) * 4;
          uVar30 = (&UNK_0040c7ac)[lVar24];
          uVar31 = (&UNK_0040c7ad)[lVar24];
          uVar32 = (&UNK_0040c7ae)[lVar24];
          bVar33 = (&UNK_0040c7af)[lVar24];
          uVar23 = 0;
          uVar34 = uVar30;
          uVar35 = uVar31;
          uVar36 = uVar32;
          bVar37 = bVar33;
          uVar38 = uVar30;
          uVar39 = uVar31;
          uVar40 = uVar32;
          bVar41 = bVar33;
          uVar42 = uVar30;
          uVar43 = uVar31;
          uVar44 = uVar32;
          bVar45 = bVar33;
          do {
            ppVar11 = local_130.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.elements_;
            pgVar10 = local_130.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.groups_;
            pgVar1 = local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_ + uVar20;
            local_48 = pgVar1->m[0].n;
            uStack_47 = pgVar1->m[1].n;
            uStack_46 = pgVar1->m[2].n;
            bStack_45 = pgVar1->m[3].n;
            uStack_44 = pgVar1->m[4].n;
            uStack_43 = pgVar1->m[5].n;
            uStack_42 = pgVar1->m[6].n;
            bStack_41 = pgVar1->m[7].n;
            uStack_40 = pgVar1->m[8].n;
            uStack_3f = pgVar1->m[9].n;
            uStack_3e = pgVar1->m[10].n;
            bStack_3d = pgVar1->m[0xb].n;
            uStack_3c = pgVar1->m[0xc].n;
            uStack_3b = pgVar1->m[0xd].n;
            uStack_3a = pgVar1->m[0xe].n;
            bVar14 = pgVar1->m[0xf].n;
            auVar27[0] = -(local_48 == uVar30);
            auVar27[1] = -(uStack_47 == uVar31);
            auVar27[2] = -(uStack_46 == uVar32);
            auVar27[3] = -(bStack_45 == bVar33);
            auVar27[4] = -(uStack_44 == uVar34);
            auVar27[5] = -(uStack_43 == uVar35);
            auVar27[6] = -(uStack_42 == uVar36);
            auVar27[7] = -(bStack_41 == bVar37);
            auVar27[8] = -(uStack_40 == uVar38);
            auVar27[9] = -(uStack_3f == uVar39);
            auVar27[10] = -(uStack_3e == uVar40);
            auVar27[0xb] = -(bStack_3d == bVar41);
            auVar27[0xc] = -(uStack_3c == uVar42);
            auVar27[0xd] = -(uStack_3b == uVar43);
            auVar27[0xe] = -(uStack_3a == uVar44);
            auVar27[0xf] = -(bVar14 == bVar45);
            uVar15 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
            uVar12 = uVar20;
            bStack_39 = bVar14;
            if (uVar15 != 0) {
              do {
                bStack_2c9 = bVar45;
                uStack_2ca = uVar44;
                uStack_2cb = uVar43;
                uStack_2cc = uVar42;
                bStack_2cd = bVar41;
                uStack_2ce = uVar40;
                uStack_2cf = uVar39;
                uStack_2d0 = uVar38;
                bStack_2d1 = bVar37;
                uStack_2d2 = uVar36;
                uStack_2d3 = uVar35;
                uStack_2d4 = uVar34;
                bStack_2d5 = bVar33;
                uStack_2d6 = uVar32;
                uStack_2d7 = uVar31;
                local_2d8 = uVar30;
                local_2f8 = uVar23;
                local_300 = uVar12;
                local_310 = pbVar22;
                iVar9 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
                  }
                }
                pbVar22 = (basic_string_view<char,_std::char_traits<char>_> *)
                          ((long)&ppVar11[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar9 << 5));
                bVar13 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&local_130,local_310,pbVar22);
                if (bVar13) {
                  sVar8 = pbVar22[1]._M_len;
                  *(undefined1 *)&pbVar22[1]._M_str = 1;
                  LVar46.index = local_2a8._32_4_;
                  LVar46.scope = (Scope *)local_2a8._24_8_;
                  LVar46._12_4_ = 0;
                  sVar47 = AttributeSymbol::fromSyntax
                                     (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                        *)(sVar8 + 0x40),(Scope *)local_2a8._0_8_,LVar46);
                  portConnections = local_308;
                  if (*(long *)(sVar8 + 0x78) == 0) {
                    SVar48 = parsing::Token::range((Token *)(sVar8 + 0x60));
                    bVar13 = false;
                    goto LAB_00212e93;
                  }
                  pPVar19 = *(PropertyExprSyntax **)(sVar8 + 0x80);
                  if (pPVar19 != (PropertyExprSyntax *)0x0) goto LAB_00212c45;
                  conn_00 = BumpAllocator::
                            emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&>
                                      ((BumpAllocator *)local_2a8._16_8_,(MultiPortSymbol *)args);
                  goto LAB_00212eeb;
                }
                uVar15 = uVar15 - 1 & uVar15;
                pbVar22 = local_310;
                uVar12 = local_300;
                uVar23 = local_2f8;
                uVar30 = local_2d8;
                uVar31 = uStack_2d7;
                uVar32 = uStack_2d6;
                bVar33 = bStack_2d5;
                uVar34 = uStack_2d4;
                uVar35 = uStack_2d3;
                uVar36 = uStack_2d2;
                bVar37 = bStack_2d1;
                uVar38 = uStack_2d0;
                uVar39 = uStack_2cf;
                uVar40 = uStack_2ce;
                bVar41 = bStack_2cd;
                uVar42 = uStack_2cc;
                uVar43 = uStack_2cb;
                uVar44 = uStack_2ca;
                bVar45 = bStack_2c9;
              } while (uVar15 != 0);
              bVar14 = pgVar10[uVar20].m[0xf].n;
              uVar20 = local_300;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bVar14) == 0) break;
            lVar24 = uVar20 + uVar23;
            uVar23 = uVar23 + 1;
            uVar20 = lVar24 + 1U &
                     local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_size_mask;
          } while (uVar23 <= local_130.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                             .arrays.groups_size_mask);
          portConnections = local_308;
          uVar20 = local_90;
          if (local_d7 == true) {
            bVar13 = true;
            sVar47 = local_f8;
            SVar48 = local_e8;
LAB_00212e93:
            conn_00 = anon_unknown_0::PortConnectionBuilder::
                      implicitNamedPort<slang::ast::MultiPortSymbol>
                                ((PortConnectionBuilder *)local_2a8,(MultiPortSymbol *)args,sVar47,
                                 SVar48,bVar13);
            goto LAB_00212eeb;
          }
        }
LAB_002129e0:
        local_90 = uVar20;
        conn_00 = anon_unknown_0::PortConnectionBuilder::getConnection<slang::ast::MultiPortSymbol>
                  ::anon_class_16_2_3fb12ad6::operator()((anon_class_16_2_3fb12ad6 *)&local_2e8);
      }
LAB_00212eeb:
      local_2f0 = conn_00;
      SmallVectorBase<slang::ast::PortConnection_const*>::
      emplace_back<slang::ast::PortConnection_const*const&>
                ((SmallVectorBase<slang::ast::PortConnection_const*> *)portConnections,&local_2f0);
    }
    else if (SVar2 == Port) {
      local_2e8.info = (Info *)local_2a8;
      local_2e8._0_8_ = args;
      pEVar5 = args->initializerSyntax;
      pEVar6 = args->initializer;
      AVar3 = args->direction;
      if (local_d8 == true) {
        uVar20 = local_90 + 1;
        if (local_90 < (ulong)local_2a8._56_8_) {
          pPVar7 = *(pointer)(local_2a8._48_8_ + local_90 * 8);
          syntax._M_ptr =
               (pPVar7->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax._M_extent._M_extent_value =
               (pPVar7->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          lookupLocation_00.index = local_2a8._32_4_;
          lookupLocation_00.scope = (Scope *)local_2a8._24_8_;
          lookupLocation_00._12_4_ = 0;
          local_90 = local_90 + 1;
          sVar47 = AttributeSymbol::fromSyntax(syntax,(Scope *)local_2a8._0_8_,lookupLocation_00);
          if ((pPVar7->super_SyntaxNode).kind == OrderedPortConnection) {
            pPVar19 = *(PropertyExprSyntax **)&pPVar7[1].super_SyntaxNode;
LAB_00212bd3:
            local_2f0 = anon_unknown_0::PortConnectionBuilder::
                        createConnection<slang::ast::PortSymbol>
                                  ((PortConnectionBuilder *)local_2a8,args,pPVar19,sVar47);
            goto LAB_00212ec4;
          }
        }
        else {
LAB_00212b18:
          local_90 = uVar20;
          if (AVar3 != In || pEVar5 == (ExpressionSyntax *)0x0 && pEVar6 == (Expression *)0x0)
          goto LAB_00212b3d;
          sVar47 = (span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>)
                   ZEXT816(0);
        }
        local_2f0 = anon_unknown_0::PortConnectionBuilder::defaultConnection
                              ((PortConnectionBuilder *)local_2a8,args,sVar47);
      }
      else {
        if ((args->super_Symbol).name._M_len != 0) {
          pbVar22 = &(args->super_Symbol).name;
          uVar16 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_130,pbVar22);
          uVar23 = uVar16 >> ((byte)local_130.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                                    .arrays.groups_size_index & 0x3f);
          lVar24 = (uVar16 & 0xff) * 4;
          uVar30 = (&UNK_0040c7ac)[lVar24];
          uVar31 = (&UNK_0040c7ad)[lVar24];
          uVar32 = (&UNK_0040c7ae)[lVar24];
          bVar33 = (&UNK_0040c7af)[lVar24];
          uVar20 = 0;
          uVar34 = uVar30;
          uVar35 = uVar31;
          uVar36 = uVar32;
          bVar37 = bVar33;
          uVar38 = uVar30;
          uVar39 = uVar31;
          uVar40 = uVar32;
          bVar41 = bVar33;
          uVar42 = uVar30;
          uVar43 = uVar31;
          uVar44 = uVar32;
          bVar45 = bVar33;
          do {
            ppVar11 = local_130.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.elements_;
            pgVar1 = local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_ + uVar23;
            local_58 = pgVar1->m[0].n;
            uStack_57 = pgVar1->m[1].n;
            uStack_56 = pgVar1->m[2].n;
            bStack_55 = pgVar1->m[3].n;
            uStack_54 = pgVar1->m[4].n;
            uStack_53 = pgVar1->m[5].n;
            uStack_52 = pgVar1->m[6].n;
            bStack_51 = pgVar1->m[7].n;
            uStack_50 = pgVar1->m[8].n;
            uStack_4f = pgVar1->m[9].n;
            uStack_4e = pgVar1->m[10].n;
            bStack_4d = pgVar1->m[0xb].n;
            uStack_4c = pgVar1->m[0xc].n;
            uStack_4b = pgVar1->m[0xd].n;
            uStack_4a = pgVar1->m[0xe].n;
            bVar14 = pgVar1->m[0xf].n;
            auVar26[0] = -(local_58 == uVar30);
            auVar26[1] = -(uStack_57 == uVar31);
            auVar26[2] = -(uStack_56 == uVar32);
            auVar26[3] = -(bStack_55 == bVar33);
            auVar26[4] = -(uStack_54 == uVar34);
            auVar26[5] = -(uStack_53 == uVar35);
            auVar26[6] = -(uStack_52 == uVar36);
            auVar26[7] = -(bStack_51 == bVar37);
            auVar26[8] = -(uStack_50 == uVar38);
            auVar26[9] = -(uStack_4f == uVar39);
            auVar26[10] = -(uStack_4e == uVar40);
            auVar26[0xb] = -(bStack_4d == bVar41);
            auVar26[0xc] = -(uStack_4c == uVar42);
            auVar26[0xd] = -(uStack_4b == uVar43);
            auVar26[0xe] = -(uStack_4a == uVar44);
            auVar26[0xf] = -(bVar14 == bVar45);
            uVar15 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
            bStack_49 = bVar14;
            if (uVar15 != 0) {
              local_2c0 = local_130.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                          .arrays.groups_ + uVar23;
              local_310 = pbVar22;
              local_300 = uVar23;
              local_2f8 = uVar20;
              local_2d8 = uVar30;
              uStack_2d7 = uVar31;
              uStack_2d6 = uVar32;
              bStack_2d5 = bVar33;
              uStack_2d4 = uVar34;
              uStack_2d3 = uVar35;
              uStack_2d2 = uVar36;
              bStack_2d1 = bVar37;
              uStack_2d0 = uVar38;
              uStack_2cf = uVar39;
              uStack_2ce = uVar40;
              bStack_2cd = bVar41;
              uStack_2cc = uVar42;
              uStack_2cb = uVar43;
              uStack_2ca = uVar44;
              bStack_2c9 = bVar45;
              do {
                iVar9 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
                  }
                }
                pbVar22 = (basic_string_view<char,_std::char_traits<char>_> *)
                          ((long)&ppVar11[uVar23 * 0xf].first._M_len + (ulong)(uint)(iVar9 << 5));
                bVar13 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&local_130,local_310,pbVar22);
                if (bVar13) {
                  sVar8 = pbVar22[1]._M_len;
                  *(undefined1 *)&pbVar22[1]._M_str = 1;
                  lookupLocation_03.index = local_2a8._32_4_;
                  lookupLocation_03.scope = (Scope *)local_2a8._24_8_;
                  lookupLocation_03._12_4_ = 0;
                  sVar47 = AttributeSymbol::fromSyntax
                                     (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                        *)(sVar8 + 0x40),(Scope *)local_2a8._0_8_,lookupLocation_03)
                  ;
                  portConnections = local_308;
                  if (*(long *)(sVar8 + 0x78) == 0) {
                    SVar48 = parsing::Token::range((Token *)(sVar8 + 0x60));
                    bVar13 = false;
                    goto LAB_00212e61;
                  }
                  pPVar19 = *(PropertyExprSyntax **)(sVar8 + 0x80);
                  if (pPVar19 != (PropertyExprSyntax *)0x0) goto LAB_00212bd3;
                  local_2f0 = BumpAllocator::
                              emplace<slang::ast::PortConnection,slang::ast::PortSymbol_const&>
                                        ((BumpAllocator *)local_2a8._16_8_,args);
                  goto LAB_00212ec4;
                }
                uVar15 = uVar15 - 1 & uVar15;
              } while (uVar15 != 0);
              bVar14 = local_2c0->m[0xf].n;
              uVar20 = local_2f8;
              pbVar22 = local_310;
              uVar23 = local_300;
              uVar30 = local_2d8;
              uVar31 = uStack_2d7;
              uVar32 = uStack_2d6;
              bVar33 = bStack_2d5;
              uVar34 = uStack_2d4;
              uVar35 = uStack_2d3;
              uVar36 = uStack_2d2;
              bVar37 = bStack_2d1;
              uVar38 = uStack_2d0;
              uVar39 = uStack_2cf;
              uVar40 = uStack_2ce;
              bVar41 = bStack_2cd;
              uVar42 = uStack_2cc;
              uVar43 = uStack_2cb;
              uVar44 = uStack_2ca;
              bVar45 = bStack_2c9;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bVar14) == 0) break;
            lVar24 = uVar23 + uVar20;
            uVar20 = uVar20 + 1;
            uVar23 = lVar24 + 1U &
                     local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_size_mask;
          } while (uVar20 <= local_130.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                             .arrays.groups_size_mask);
          portConnections = local_308;
          uVar20 = local_90;
          if (local_d7 == true) {
            bVar13 = true;
            sVar47 = local_f8;
            SVar48 = local_e8;
LAB_00212e61:
            local_2f0 = anon_unknown_0::PortConnectionBuilder::
                        implicitNamedPort<slang::ast::PortSymbol>
                                  ((PortConnectionBuilder *)local_2a8,args,sVar47,SVar48,bVar13);
            goto LAB_00212ec4;
          }
          goto LAB_00212b18;
        }
LAB_00212b3d:
        local_2f0 = anon_unknown_0::PortConnectionBuilder::getConnection<slang::ast::PortSymbol>::
                    anon_class_16_2_3fb12ad6::operator()((anon_class_16_2_3fb12ad6 *)&local_2e8);
      }
LAB_00212ec4:
      SmallVectorBase<slang::ast::PortConnection_const*>::
      emplace_back<slang::ast::PortConnection_const*const&>
                ((SmallVectorBase<slang::ast::PortConnection_const*> *)portConnections,&local_2f0);
    }
    else {
      if (((args->internalSymbol == (Symbol *)0x0) && (((ulong)args->type & 1) == 0)) ||
         ((args->super_Symbol).name._M_len == 0)) {
        if (local_d8 == true) {
          local_90 = local_90 + 1;
        }
        else {
          pbVar22 = &(args->super_Symbol).name;
          uVar16 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_130,pbVar22);
          uVar20 = uVar16 >> ((byte)local_130.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                                    .arrays.groups_size_index & 0x3f);
          lVar24 = (uVar16 & 0xff) * 4;
          uVar30 = (&UNK_0040c7ac)[lVar24];
          uVar31 = (&UNK_0040c7ad)[lVar24];
          uVar32 = (&UNK_0040c7ae)[lVar24];
          bVar33 = (&UNK_0040c7af)[lVar24];
          uVar23 = 0;
          uVar34 = uVar30;
          uVar35 = uVar31;
          uVar36 = uVar32;
          bVar37 = bVar33;
          uVar38 = uVar30;
          uVar39 = uVar31;
          uVar40 = uVar32;
          bVar41 = bVar33;
          uVar42 = uVar30;
          uVar43 = uVar31;
          uVar44 = uVar32;
          bVar45 = bVar33;
          do {
            ppVar11 = local_130.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.elements_;
            pgVar10 = local_130.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.groups_;
            pgVar1 = local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_ + uVar20;
            local_78 = pgVar1->m[0].n;
            uStack_77 = pgVar1->m[1].n;
            uStack_76 = pgVar1->m[2].n;
            bStack_75 = pgVar1->m[3].n;
            uStack_74 = pgVar1->m[4].n;
            uStack_73 = pgVar1->m[5].n;
            uStack_72 = pgVar1->m[6].n;
            bStack_71 = pgVar1->m[7].n;
            uStack_70 = pgVar1->m[8].n;
            uStack_6f = pgVar1->m[9].n;
            uStack_6e = pgVar1->m[10].n;
            bStack_6d = pgVar1->m[0xb].n;
            uStack_6c = pgVar1->m[0xc].n;
            uStack_6b = pgVar1->m[0xd].n;
            uStack_6a = pgVar1->m[0xe].n;
            bVar14 = pgVar1->m[0xf].n;
            auVar28[0] = -(local_78 == uVar30);
            auVar28[1] = -(uStack_77 == uVar31);
            auVar28[2] = -(uStack_76 == uVar32);
            auVar28[3] = -(bStack_75 == bVar33);
            auVar28[4] = -(uStack_74 == uVar34);
            auVar28[5] = -(uStack_73 == uVar35);
            auVar28[6] = -(uStack_72 == uVar36);
            auVar28[7] = -(bStack_71 == bVar37);
            auVar28[8] = -(uStack_70 == uVar38);
            auVar28[9] = -(uStack_6f == uVar39);
            auVar28[10] = -(uStack_6e == uVar40);
            auVar28[0xb] = -(bStack_6d == bVar41);
            auVar28[0xc] = -(uStack_6c == uVar42);
            auVar28[0xd] = -(uStack_6b == uVar43);
            auVar28[0xe] = -(uStack_6a == uVar44);
            auVar28[0xf] = -(bVar14 == bVar45);
            uVar15 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
            uVar12 = uVar20;
            bStack_69 = bVar14;
            if (uVar15 != 0) {
              do {
                bStack_2c9 = bVar45;
                uStack_2ca = uVar44;
                uStack_2cb = uVar43;
                uStack_2cc = uVar42;
                bStack_2cd = bVar41;
                uStack_2ce = uVar40;
                uStack_2cf = uVar39;
                uStack_2d0 = uVar38;
                bStack_2d1 = bVar37;
                uStack_2d2 = uVar36;
                uStack_2d3 = uVar35;
                uStack_2d4 = uVar34;
                bStack_2d5 = bVar33;
                uStack_2d6 = uVar32;
                uStack_2d7 = uVar31;
                local_2d8 = uVar30;
                local_2f8 = uVar23;
                local_300 = uVar12;
                local_310 = pbVar22;
                iVar9 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
                  }
                }
                pbVar22 = (basic_string_view<char,_std::char_traits<char>_> *)
                          ((long)&ppVar11[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar9 << 5));
                bVar13 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&local_130,local_310,pbVar22);
                if (bVar13) {
                  *(undefined1 *)&pbVar22[1]._M_str = 1;
                  portConnections = local_308;
                  goto LAB_00212b55;
                }
                uVar15 = uVar15 - 1 & uVar15;
                pbVar22 = local_310;
                uVar12 = local_300;
                uVar23 = local_2f8;
                uVar30 = local_2d8;
                uVar31 = uStack_2d7;
                uVar32 = uStack_2d6;
                bVar33 = bStack_2d5;
                uVar34 = uStack_2d4;
                uVar35 = uStack_2d3;
                uVar36 = uStack_2d2;
                bVar37 = bStack_2d1;
                uVar38 = uStack_2d0;
                uVar39 = uStack_2cf;
                uVar40 = uStack_2ce;
                bVar41 = bStack_2cd;
                uVar42 = uStack_2cc;
                uVar43 = uStack_2cb;
                uVar44 = uStack_2ca;
                bVar45 = bStack_2c9;
              } while (uVar15 != 0);
              bVar14 = pgVar10[uVar20].m[0xf].n;
              uVar20 = local_300;
            }
            portConnections = local_308;
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bVar14) == 0) break;
            lVar24 = uVar20 + uVar23;
            uVar23 = uVar23 + 1;
            uVar20 = lVar24 + 1U &
                     local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_size_mask;
          } while (uVar23 <= local_130.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                             .arrays.groups_size_mask);
        }
LAB_00212b55:
        local_2f0 = BumpAllocator::
                    emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&>
                              ((BumpAllocator *)local_2a8._16_8_,(InterfacePortSymbol *)args);
      }
      else {
        local_2e8.info = (Info *)args;
        local_2e8._0_8_ = local_2a8;
        if (local_d8 == true) {
          sVar47 = (span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>)
                   ZEXT816(0);
          pPVar19 = (PropertyExprSyntax *)0x0;
          if (local_90 < (ulong)local_2a8._56_8_) {
            pPVar7 = *(pointer)(local_2a8._48_8_ + local_90 * 8);
            syntax_01._M_ptr =
                 (pPVar7->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr
            ;
            syntax_01._M_extent._M_extent_value =
                 (pPVar7->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
            lookupLocation_02.index = local_2a8._32_4_;
            lookupLocation_02.scope = (Scope *)local_2a8._24_8_;
            lookupLocation_02._12_4_ = 0;
            sVar47 = AttributeSymbol::fromSyntax
                               (syntax_01,(Scope *)local_2a8._0_8_,lookupLocation_02);
            if ((pPVar7->super_SyntaxNode).kind == OrderedPortConnection) {
              pPVar19 = *(PropertyExprSyntax **)&pPVar7[1].super_SyntaxNode;
            }
            else {
              pPVar19 = (PropertyExprSyntax *)0x0;
            }
          }
          local_90 = local_90 + 1;
LAB_00212f15:
          if (pPVar19 == (PropertyExprSyntax *)0x0) {
LAB_00212f35:
            local_2f0 = anon_unknown_0::PortConnectionBuilder::getIfaceConnection::
                        anon_class_16_2_3fe4823c::operator()((anon_class_16_2_3fe4823c *)&local_2e8)
            ;
          }
          else {
            local_2f0 = anon_unknown_0::PortConnectionBuilder::getInterfaceExpr
                                  ((PortConnectionBuilder *)local_2a8,(InterfacePortSymbol *)args,
                                   pPVar19,sVar47);
          }
        }
        else {
          pbVar22 = &(args->super_Symbol).name;
          uVar16 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_130,pbVar22);
          uVar20 = uVar16 >> ((byte)local_130.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                                    .arrays.groups_size_index & 0x3f);
          lVar24 = (uVar16 & 0xff) * 4;
          uVar30 = (&UNK_0040c7ac)[lVar24];
          uVar31 = (&UNK_0040c7ad)[lVar24];
          uVar32 = (&UNK_0040c7ae)[lVar24];
          bVar33 = (&UNK_0040c7af)[lVar24];
          uVar23 = 0;
          uVar34 = uVar30;
          uVar35 = uVar31;
          uVar36 = uVar32;
          bVar37 = bVar33;
          uVar38 = uVar30;
          uVar39 = uVar31;
          uVar40 = uVar32;
          bVar41 = bVar33;
          uVar42 = uVar30;
          uVar43 = uVar31;
          uVar44 = uVar32;
          bVar45 = bVar33;
          do {
            ppVar11 = local_130.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.elements_;
            pgVar10 = local_130.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.groups_;
            pgVar1 = local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_ + uVar20;
            local_68 = pgVar1->m[0].n;
            uStack_67 = pgVar1->m[1].n;
            uStack_66 = pgVar1->m[2].n;
            bStack_65 = pgVar1->m[3].n;
            uStack_64 = pgVar1->m[4].n;
            uStack_63 = pgVar1->m[5].n;
            uStack_62 = pgVar1->m[6].n;
            bStack_61 = pgVar1->m[7].n;
            uStack_60 = pgVar1->m[8].n;
            uStack_5f = pgVar1->m[9].n;
            uStack_5e = pgVar1->m[10].n;
            bStack_5d = pgVar1->m[0xb].n;
            uStack_5c = pgVar1->m[0xc].n;
            uStack_5b = pgVar1->m[0xd].n;
            uStack_5a = pgVar1->m[0xe].n;
            bVar14 = pgVar1->m[0xf].n;
            auVar29[0] = -(local_68 == uVar30);
            auVar29[1] = -(uStack_67 == uVar31);
            auVar29[2] = -(uStack_66 == uVar32);
            auVar29[3] = -(bStack_65 == bVar33);
            auVar29[4] = -(uStack_64 == uVar34);
            auVar29[5] = -(uStack_63 == uVar35);
            auVar29[6] = -(uStack_62 == uVar36);
            auVar29[7] = -(bStack_61 == bVar37);
            auVar29[8] = -(uStack_60 == uVar38);
            auVar29[9] = -(uStack_5f == uVar39);
            auVar29[10] = -(uStack_5e == uVar40);
            auVar29[0xb] = -(bStack_5d == bVar41);
            auVar29[0xc] = -(uStack_5c == uVar42);
            auVar29[0xd] = -(uStack_5b == uVar43);
            auVar29[0xe] = -(uStack_5a == uVar44);
            auVar29[0xf] = -(bVar14 == bVar45);
            uVar15 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe);
            uVar12 = uVar20;
            bStack_59 = bVar14;
            if (uVar15 != 0) {
              do {
                bStack_2c9 = bVar45;
                uStack_2ca = uVar44;
                uStack_2cb = uVar43;
                uStack_2cc = uVar42;
                bStack_2cd = bVar41;
                uStack_2ce = uVar40;
                uStack_2cf = uVar39;
                uStack_2d0 = uVar38;
                bStack_2d1 = bVar37;
                uStack_2d2 = uVar36;
                uStack_2d3 = uVar35;
                uStack_2d4 = uVar34;
                bStack_2d5 = bVar33;
                uStack_2d6 = uVar32;
                uStack_2d7 = uVar31;
                local_2d8 = uVar30;
                local_2f8 = uVar23;
                local_300 = uVar12;
                local_310 = pbVar22;
                iVar9 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
                  }
                }
                pbVar22 = (basic_string_view<char,_std::char_traits<char>_> *)
                          ((long)&ppVar11[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar9 << 5));
                bVar13 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&local_130,local_310,pbVar22);
                if (bVar13) {
                  sVar8 = pbVar22[1]._M_len;
                  *(undefined1 *)&pbVar22[1]._M_str = 1;
                  lookupLocation_04.index = local_2a8._32_4_;
                  lookupLocation_04.scope = (Scope *)local_2a8._24_8_;
                  lookupLocation_04._12_4_ = 0;
                  sVar47 = AttributeSymbol::fromSyntax
                                     (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                        *)(sVar8 + 0x40),(Scope *)local_2a8._0_8_,lookupLocation_04)
                  ;
                  portConnections = local_308;
                  if (*(long *)(sVar8 + 0x78) != 0) {
                    pPVar19 = *(PropertyExprSyntax **)(sVar8 + 0x80);
                    goto LAB_00212f15;
                  }
                  SVar48 = parsing::Token::range((Token *)(sVar8 + 0x60));
                  bVar13 = false;
                  goto LAB_00212f55;
                }
                uVar15 = uVar15 - 1 & uVar15;
                pbVar22 = local_310;
                uVar12 = local_300;
                uVar23 = local_2f8;
                uVar30 = local_2d8;
                uVar31 = uStack_2d7;
                uVar32 = uStack_2d6;
                bVar33 = bStack_2d5;
                uVar34 = uStack_2d4;
                uVar35 = uStack_2d3;
                uVar36 = uStack_2d2;
                bVar37 = bStack_2d1;
                uVar38 = uStack_2d0;
                uVar39 = uStack_2cf;
                uVar40 = uStack_2ce;
                bVar41 = bStack_2cd;
                uVar42 = uStack_2cc;
                uVar43 = uStack_2cb;
                uVar44 = uStack_2ca;
                bVar45 = bStack_2c9;
              } while (uVar15 != 0);
              bVar14 = pgVar10[uVar20].m[0xf].n;
              uVar20 = local_300;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bVar14) == 0) break;
            lVar24 = uVar20 + uVar23;
            uVar23 = uVar23 + 1;
            uVar20 = lVar24 + 1U &
                     local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_size_mask;
          } while (uVar23 <= local_130.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                             .arrays.groups_size_mask);
          portConnections = local_308;
          if (local_d7 != true) goto LAB_00212f35;
          bVar13 = true;
          sVar47 = local_f8;
          SVar48 = local_e8;
LAB_00212f55:
          local_2f0 = anon_unknown_0::PortConnectionBuilder::getImplicitInterface
                                ((PortConnectionBuilder *)local_2a8,(InterfacePortSymbol *)args,
                                 SVar48,sVar47,bVar13);
        }
      }
      SmallVectorBase<slang::ast::PortConnection_const*>::
      emplace_back<slang::ast::PortConnection_const*const&>
                ((SmallVectorBase<slang::ast::PortConnection_const*> *)portConnections,&local_2f0);
    }
    instance = (InstanceSymbol *)&(local_2b0->super_InstanceSymbolBase).super_Symbol.name;
  } while( true );
}

Assistant:

void PortConnection::makeConnections(
    const InstanceSymbol& instance, std::span<const Symbol* const> ports,
    const SeparatedSyntaxList<PortConnectionSyntax>& portConnections,
    SmallVector<const PortConnection*>& results) {

    PortConnectionBuilder builder(instance, portConnections);
    for (auto portBase : ports) {
        if (portBase->kind == SymbolKind::Port) {
            auto& port = portBase->as<PortSymbol>();
            auto conn = builder.getConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
        else if (portBase->kind == SymbolKind::MultiPort) {
            auto& port = portBase->as<MultiPortSymbol>();
            auto conn = builder.getConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
        else {
            auto& port = portBase->as<InterfacePortSymbol>();
            auto conn = builder.getIfaceConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
    }

    builder.finalize();
}